

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::TestCase::TestCase
          (TestCase *this,funcType test,char *file,uint line,TestSuite *test_suite,String *type,
          int template_id)

{
  String local_50;
  String *local_38;
  String *type_local;
  TestSuite *test_suite_local;
  char *pcStack_20;
  uint line_local;
  char *file_local;
  funcType test_local;
  TestCase *this_local;
  
  local_38 = type;
  type_local = (String *)test_suite;
  test_suite_local._4_4_ = line;
  pcStack_20 = file;
  file_local = (char *)test;
  test_local = (funcType)this;
  TestCaseData::TestCaseData(&this->super_TestCaseData);
  String::String(&this->m_type);
  String::String(&this->m_full_name);
  String::String(&local_50,pcStack_20);
  String::operator=((String *)this,&local_50);
  String::~String(&local_50);
  (this->super_TestCaseData).m_line = test_suite_local._4_4_;
  (this->super_TestCaseData).m_name = (char *)0x0;
  (this->super_TestCaseData).m_test_suite = (type_local->field_0).data.ptr;
  (this->super_TestCaseData).m_description = *(char **)((long)&type_local->field_0 + 8);
  (this->super_TestCaseData).m_skip = (bool)((type_local->field_0).buf[0x10] & 1);
  (this->super_TestCaseData).m_no_breaks = (bool)((type_local->field_0).buf[0x11] & 1);
  (this->super_TestCaseData).m_no_output = (bool)((type_local->field_0).buf[0x12] & 1);
  (this->super_TestCaseData).m_may_fail = (bool)((type_local->field_0).buf[0x13] & 1);
  (this->super_TestCaseData).m_should_fail = (bool)((type_local->field_0).buf[0x14] & 1);
  (this->super_TestCaseData).m_expected_failures = *(int *)&type_local[1].field_0;
  (this->super_TestCaseData).m_timeout = *(double *)((long)&type_local[1].field_0 + 8);
  this->m_test = (funcType)file_local;
  String::operator=(&this->m_type,local_38);
  this->m_template_id = template_id;
  return;
}

Assistant:

TestCase::TestCase(funcType test, const char* file, unsigned line, const TestSuite& test_suite,
                       const String& type, int template_id) {
        m_file              = file;
        m_line              = line;
        m_name              = nullptr; // will be later overridden in operator*
        m_test_suite        = test_suite.m_test_suite;
        m_description       = test_suite.m_description;
        m_skip              = test_suite.m_skip;
        m_no_breaks         = test_suite.m_no_breaks;
        m_no_output         = test_suite.m_no_output;
        m_may_fail          = test_suite.m_may_fail;
        m_should_fail       = test_suite.m_should_fail;
        m_expected_failures = test_suite.m_expected_failures;
        m_timeout           = test_suite.m_timeout;

        m_test        = test;
        m_type        = type;
        m_template_id = template_id;
    }